

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<float,float,float,duckdb::BinaryZeroIsNullWrapper,duckdb::ModuloOperator,bool,true,false>
               (float *ldata,float *rdata,float *result_data,idx_t count,ValidityMask *mask,bool fun
               )

{
  unsigned_long *puVar1;
  ulong uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  byte bVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  float *pfVar7;
  float *pfVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  _Head_base<0UL,_unsigned_long_*,_false> _Var10;
  ulong uVar11;
  ulong uVar12;
  idx_t idx_in_entry_1;
  ulong uVar13;
  idx_t idx_in_entry;
  ulong uVar14;
  float fVar15;
  float fVar16;
  float lentry;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  float *local_80;
  idx_t local_78;
  float *local_70;
  float *local_68;
  float local_5c;
  idx_t local_58;
  ulong local_50;
  buffer_ptr<ValidityBuffer> *local_48;
  ulong local_40;
  float *local_38;
  
  local_70 = rdata;
  local_68 = ldata;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      fVar16 = *ldata;
      uVar14 = 0;
      do {
        fVar15 = local_70[uVar14];
        if ((fVar15 != 0.0) || (NAN(fVar15))) {
          fVar15 = fmodf(fVar16,fVar15);
        }
        else {
          _Var10._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (_Var10._M_head_impl == (unsigned_long *)0x0) {
            local_78 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_98,&local_78);
            p_Var6 = p_Stack_90;
            peVar5 = local_98;
            local_98 = (element_type *)0x0;
            p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar5;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var6;
            if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
               p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
            }
            pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
            _Var10._M_head_impl =
                 (pTVar9->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var10._M_head_impl;
          }
          bVar4 = (byte)uVar14 & 0x3f;
          _Var10._M_head_impl[uVar14 >> 6] =
               _Var10._M_head_impl[uVar14 >> 6] &
               (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
          fVar15 = fVar16;
        }
        result_data[uVar14] = fVar15;
        uVar14 = uVar14 + 1;
      } while (count != uVar14);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_50 = count + 0x3f >> 6;
    local_48 = &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    local_40 = 0;
    uVar14 = 0;
    local_80 = result_data;
    local_58 = count;
    do {
      pfVar8 = local_70;
      pfVar7 = local_80;
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar11 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar11 = count;
        }
LAB_010ddf48:
        uVar12 = uVar14;
        if (uVar14 < uVar11) {
          fVar16 = *local_68;
          do {
            fVar15 = pfVar8[uVar14];
            if ((fVar15 != 0.0) || (NAN(fVar15))) {
              fVar15 = fmodf(fVar16,fVar15);
            }
            else {
              _Var10._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask
              ;
              if (_Var10._M_head_impl == (unsigned_long *)0x0) {
                local_78 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_98,&local_78);
                p_Var6 = p_Stack_90;
                peVar5 = local_98;
                local_98 = (element_type *)0x0;
                p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = peVar5;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var6;
                if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
                   p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                }
                pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                   (local_48);
                _Var10._M_head_impl =
                     (pTVar9->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                     _Var10._M_head_impl;
              }
              bVar4 = (byte)uVar14 & 0x3f;
              _Var10._M_head_impl[uVar14 >> 6] =
                   _Var10._M_head_impl[uVar14 >> 6] &
                   (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
              fVar15 = fVar16;
            }
            result_data[uVar14] = fVar15;
            uVar14 = uVar14 + 1;
            uVar12 = uVar11;
          } while (uVar11 != uVar14);
        }
      }
      else {
        uVar2 = puVar1[local_40];
        uVar11 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar11 = count;
        }
        uVar12 = uVar11;
        result_data = local_80;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_010ddf48;
          uVar12 = uVar14;
          count = local_58;
          if (uVar14 < uVar11) {
            local_38 = local_70 + uVar14;
            uVar13 = 0;
            do {
              if ((uVar2 >> (uVar13 & 0x3f) & 1) != 0) {
                fVar16 = *local_68;
                fVar15 = local_38[uVar13];
                if ((fVar15 != 0.0) || (NAN(fVar15))) {
                  fVar16 = fmodf(fVar16,fVar15);
                }
                else {
                  _Var10._M_head_impl =
                       (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                  if (_Var10._M_head_impl == (unsigned_long *)0x0) {
                    local_78 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                    local_5c = fVar16;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)&local_98,&local_78);
                    p_Var6 = p_Stack_90;
                    peVar5 = local_98;
                    local_98 = (element_type *)0x0;
                    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                             internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = peVar5;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = p_Var6;
                    if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                       (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
                       p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                    }
                    pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                             operator->(local_48);
                    _Var10._M_head_impl =
                         (pTVar9->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                         _Var10._M_head_impl;
                    fVar16 = local_5c;
                  }
                  bVar4 = (byte)(uVar14 + uVar13) & 0x3f;
                  _Var10._M_head_impl[uVar14 + uVar13 >> 6] =
                       _Var10._M_head_impl[uVar14 + uVar13 >> 6] &
                       (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
                }
                pfVar7[uVar14 + uVar13] = fVar16;
              }
              uVar13 = uVar13 + 1;
              uVar12 = uVar11;
              count = local_58;
              result_data = local_80;
            } while (uVar11 - uVar14 != uVar13);
          }
        }
      }
      local_40 = local_40 + 1;
      uVar14 = uVar12;
    } while (local_40 != local_50);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}